

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadMultiLineText
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          char **a_pVal,char *a_pTagName,bool a_bAllowBlankLinesInComment)

{
  bool bVar1;
  size_t __n;
  byte local_71;
  size_t nLen;
  char *pcStack_58;
  int nNewLines;
  char *pCurr;
  char *pcStack_48;
  char cEndOfLineChar;
  char *pCurrLine;
  char *pDataLine;
  char *pcStack_30;
  bool a_bAllowBlankLinesInComment_local;
  char *a_pTagName_local;
  char **a_pVal_local;
  char **a_pData_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  pCurrLine = *a_pData;
  *a_pVal = *a_pData;
  pCurr._7_1_ = **a_pData;
  pDataLine._7_1_ = a_bAllowBlankLinesInComment;
  pcStack_30 = a_pTagName;
  a_pTagName_local = (char *)a_pVal;
  a_pVal_local = a_pData;
  a_pData_local = &this->m_pData;
LAB_0018c8ad:
  while ((pcStack_30 != (char *)0x0 || (bVar1 = IsComment(this,**a_pVal_local), bVar1))) {
    pcStack_48 = *a_pVal_local;
    while( true ) {
      local_71 = 0;
      if (**a_pVal_local != '\0') {
        bVar1 = IsNewLineChar(this,**a_pVal_local);
        local_71 = bVar1 ^ 0xff;
      }
      if ((local_71 & 1) == 0) break;
      *a_pVal_local = *a_pVal_local + 1;
    }
    if (pCurrLine < pcStack_48) {
      __n = (long)*a_pVal_local - (long)pcStack_48;
      memmove(pCurrLine,pcStack_48,__n);
      pCurrLine[__n] = '\0';
    }
    pCurr._7_1_ = **a_pVal_local;
    **a_pVal_local = '\0';
    if (((pcStack_30 != (char *)0x0) && (bVar1 = IsLess(this,pCurrLine,pcStack_30), !bVar1)) &&
       (bVar1 = IsLess(this,pcStack_30,pCurrLine), !bVar1)) goto LAB_0018caba;
    if (pCurr._7_1_ == '\0') {
      return true;
    }
    pCurrLine = pCurrLine + ((long)*a_pVal_local - (long)pcStack_48);
    **a_pVal_local = pCurr._7_1_;
    SkipNewLine(this,a_pVal_local);
    *pCurrLine = '\n';
    pCurrLine = pCurrLine + 1;
  }
  if ((pDataLine._7_1_ & 1) != 0) {
    pcStack_58 = *a_pVal_local;
    nLen._4_4_ = 0;
    while (bVar1 = IsSpace(this,*pcStack_58), bVar1) {
      bVar1 = IsNewLineChar(this,*pcStack_58);
      if (bVar1) {
        nLen._4_4_ = nLen._4_4_ + 1;
        SkipNewLine(this,&stack0xffffffffffffffa8);
      }
      else {
        pcStack_58 = pcStack_58 + 1;
      }
    }
    bVar1 = IsComment(this,*pcStack_58);
    if (bVar1) {
      for (; 0 < nLen._4_4_; nLen._4_4_ = nLen._4_4_ + -1) {
        *pCurrLine = '\n';
        pCurrLine = pCurrLine + 1;
      }
      *a_pVal_local = pcStack_58;
      goto LAB_0018c8ad;
    }
  }
LAB_0018caba:
  if (*(char **)a_pTagName_local == *a_pVal_local) {
    a_pTagName_local[0] = '\0';
    a_pTagName_local[1] = '\0';
    a_pTagName_local[2] = '\0';
    a_pTagName_local[3] = '\0';
    a_pTagName_local[4] = '\0';
    a_pTagName_local[5] = '\0';
    a_pTagName_local[6] = '\0';
    a_pTagName_local[7] = '\0';
    return false;
  }
  pCurrLine[-1] = '\0';
  if ((pcStack_30 != (char *)0x0) && (pCurr._7_1_ != '\0')) {
    pCurrLine = pCurrLine + -1;
    bVar1 = IsNewLineChar(this,pCurr._7_1_);
    if (!bVar1) {
      __assert_fail("IsNewLineChar(cEndOfLineChar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/../../src/library/ini/SimpleIni.h"
                    ,0x713,
                    "bool CSimpleIniTempl<char, SI_GenericNoCase<char>, SI_ConvertA<char>>::LoadMultiLineText(SI_CHAR *&, const SI_CHAR *&, const SI_CHAR *, bool) const [SI_CHAR = char, SI_STRLESS = SI_GenericNoCase<char>, SI_CONVERTER = SI_ConvertA<char>]"
                   );
    }
    **a_pVal_local = pCurr._7_1_;
    SkipNewLine(this,a_pVal_local);
  }
  return true;
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::LoadMultiLineText(
    SI_CHAR *&          a_pData,
    const SI_CHAR *&    a_pVal,
    const SI_CHAR *     a_pTagName,
    bool                a_bAllowBlankLinesInComment
    ) const
{
    // we modify this data to strip all newlines down to a single '\n'
    // character. This means that on Windows we need to strip out some
    // characters which will make the data shorter.
    // i.e.  LINE1-LINE1\r\nLINE2-LINE2\0 will become
    //       LINE1-LINE1\nLINE2-LINE2\0
    // The pDataLine entry is the pointer to the location in memory that
    // the current line needs to start to run following the existing one.
    // This may be the same as pCurrLine in which case no move is needed.
    SI_CHAR * pDataLine = a_pData;
    SI_CHAR * pCurrLine;

    // value starts at the current line
    a_pVal = a_pData;

    // find the end tag. This tag must start in column 1 and be
    // followed by a newline. No whitespace removal is done while
    // searching for this tag.
    SI_CHAR cEndOfLineChar = *a_pData;
    for(;;) {
        // if we are loading comments then we need a comment character as
        // the first character on every line
        if (!a_pTagName && !IsComment(*a_pData)) {
            // if we aren't allowing blank lines then we're done
            if (!a_bAllowBlankLinesInComment) {
                break;
            }

            // if we are allowing blank lines then we only include them
            // in this comment if another comment follows, so read ahead
            // to find out.
            SI_CHAR * pCurr = a_pData;
            int nNewLines = 0;
            while (IsSpace(*pCurr)) {
                if (IsNewLineChar(*pCurr)) {
                    ++nNewLines;
                    SkipNewLine(pCurr);
                }
                else {
                    ++pCurr;
                }
            }

            // we have a comment, add the blank lines to the output
            // and continue processing from here
            if (IsComment(*pCurr)) {
                for (; nNewLines > 0; --nNewLines) *pDataLine++ = '\n';
                a_pData = pCurr;
                continue;
            }

            // the comment ends here
            break;
        }

        // find the end of this line
        pCurrLine = a_pData;
        while (*a_pData && !IsNewLineChar(*a_pData)) ++a_pData;

        // move this line down to the location that it should be if necessary
        if (pDataLine < pCurrLine) {
            size_t nLen = (size_t) (a_pData - pCurrLine);
            memmove(pDataLine, pCurrLine, nLen * sizeof(SI_CHAR));
            pDataLine[nLen] = '\0';
        }

        // end the line with a NULL
        cEndOfLineChar = *a_pData;
        *a_pData = 0;

        // if are looking for a tag then do the check now. This is done before
        // checking for end of the data, so that if we have the tag at the end
        // of the data then the tag is removed correctly.
        if (a_pTagName &&
            (!IsLess(pDataLine, a_pTagName) && !IsLess(a_pTagName, pDataLine)))
        {
            break;
        }

        // if we are at the end of the data then we just automatically end
        // this entry and return the current data.
        if (!cEndOfLineChar) {
            return true;
        }

        // otherwise we need to process this newline to ensure that it consists
        // of just a single \n character.
        pDataLine += (a_pData - pCurrLine);
        *a_pData = cEndOfLineChar;
        SkipNewLine(a_pData);
        *pDataLine++ = '\n';
    }

    // if we didn't find a comment at all then return false
    if (a_pVal == a_pData) {
        a_pVal = NULL;
        return false;
    }

    // the data (which ends at the end of the last line) needs to be
    // null-terminated BEFORE before the newline character(s). If the
    // user wants a new line in the multi-line data then they need to
    // add an empty line before the tag.
    *--pDataLine = '\0';

    // if looking for a tag and if we aren't at the end of the data,
    // then move a_pData to the start of the next line.
    if (a_pTagName && cEndOfLineChar) {
        SI_ASSERT(IsNewLineChar(cEndOfLineChar));
        *a_pData = cEndOfLineChar;
        SkipNewLine(a_pData);
    }

    return true;
}